

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O1

void tidyBufClear(TidyBuffer *buf)

{
  if (buf != (TidyBuffer *)0x0) {
    if (buf->bp != (byte *)0x0) {
      memset(buf->bp,0,(ulong)buf->allocated);
      buf->size = 0;
    }
    buf->next = 0;
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/buffio.c",
                0x5d,"void tidyBufClear(TidyBuffer *)");
}

Assistant:

void TIDY_CALL tidyBufClear( TidyBuffer* buf )
{
    assert( buf != NULL );
    if ( buf->bp )
    {
        TidyClearMemory( buf->bp, buf->allocated );
        buf->size = 0;
    }
    buf->next = 0;
}